

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O0

void pzshape::TPZShapeCube::ShapeCornerCube(TPZVec<Fad<double>_> *pt,TPZVec<Fad<double>_> *phi)

{
  TPZVec<Fad<double>_> *in_RSI;
  TPZVec<Fad<double>_> *in_RDI;
  FADREAL z [2];
  FADREAL y [2];
  FADREAL x [2];
  Fad<double> *in_stack_fffffffffffffb40;
  Fad<double> *in_stack_fffffffffffffb50;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  *in_stack_fffffffffffffb58;
  Fad<double> *in_stack_fffffffffffffb60;
  Fad<double> *in_stack_fffffffffffffb70;
  Fad<double> *in_stack_fffffffffffffb78;
  Fad<double> *in_stack_fffffffffffffb80;
  double in_stack_fffffffffffffb88;
  double in_stack_fffffffffffffb90;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *in_stack_fffffffffffffb98;
  undefined1 *local_440;
  undefined1 *local_428;
  undefined1 *local_410;
  undefined1 *local_380;
  undefined1 *local_360;
  undefined1 *local_340;
  undefined1 local_e8 [64];
  undefined1 local_a8 [64];
  undefined1 auStack_68 [16];
  undefined1 local_58 [64];
  undefined1 auStack_18 [8];
  TPZVec<Fad<double>_> *local_10;
  TPZVec<Fad<double>_> *local_8;
  
  local_340 = local_58;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    Fad<double>::Fad(in_stack_fffffffffffffb50);
    local_340 = local_340 + 0x20;
  } while (local_340 != auStack_18);
  local_360 = local_a8;
  do {
    Fad<double>::Fad(in_stack_fffffffffffffb50);
    local_360 = local_360 + 0x20;
  } while (local_360 != auStack_68);
  local_380 = local_e8;
  do {
    Fad<double>::Fad(in_stack_fffffffffffffb50);
    local_380 = local_380 + 0x20;
  } while (local_380 != local_a8);
  TPZVec<Fad<double>_>::operator[](local_8,0);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  operator/<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb98,
             in_stack_fffffffffffffb90);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  TPZVec<Fad<double>_>::operator[](local_8,0);
  operator+<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  operator/<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  Fad<double>::operator=(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  TPZVec<Fad<double>_>::operator[](local_8,1);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  operator/<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb98,
             in_stack_fffffffffffffb90);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  TPZVec<Fad<double>_>::operator[](local_8,1);
  operator+<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  operator/<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  Fad<double>::operator=(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  TPZVec<Fad<double>_>::operator[](local_8,2);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  operator/<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb98,
             in_stack_fffffffffffffb90);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  TPZVec<Fad<double>_>::operator[](local_8,2);
  operator+<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  operator/<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_double,_nullptr>
            (in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
  Fad<double>::operator=(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>::
  ~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
            *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70);
  TPZVec<Fad<double>_>::operator[](local_10,0);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70);
  TPZVec<Fad<double>_>::operator[](local_10,1);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70);
  TPZVec<Fad<double>_>::operator[](local_10,2);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70);
  TPZVec<Fad<double>_>::operator[](local_10,3);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70);
  TPZVec<Fad<double>_>::operator[](local_10,4);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70);
  TPZVec<Fad<double>_>::operator[](local_10,5);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70);
  TPZVec<Fad<double>_>::operator[](local_10,6);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
  operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70);
  TPZVec<Fad<double>_>::operator[](local_10,7);
  Fad<double>::operator=
            (in_stack_fffffffffffffb60,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb58);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffb40);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffb40);
  local_410 = local_a8;
  do {
    local_410 = local_410 + -0x20;
    Fad<double>::~Fad(in_stack_fffffffffffffb40);
  } while (local_410 != local_e8);
  local_428 = auStack_68;
  do {
    local_428 = local_428 + -0x20;
    Fad<double>::~Fad(in_stack_fffffffffffffb40);
  } while (local_428 != local_a8);
  local_440 = auStack_18;
  do {
    local_440 = local_440 + -0x20;
    Fad<double>::~Fad(in_stack_fffffffffffffb40);
  } while (local_440 != local_58);
  return;
}

Assistant:

void TPZShapeCube::ShapeCornerCube(TPZVec<FADREAL> &pt, TPZVec<FADREAL> &phi)
	{
		FADREAL x[2], y[2], z[2];
		
		x[0]  = (REAL(1.)-pt[0])/REAL(2.);
		x[1]  = (REAL(1.)+pt[0])/REAL(2.);
		y[0]  = (REAL(1.)-pt[1])/REAL(2.);
		y[1]  = (REAL(1.)+pt[1])/REAL(2.);
		z[0]  = (REAL(1.)-pt[2])/REAL(2.);
		z[1]  = (REAL(1.)+pt[2])/REAL(2.);
		
		phi[0]  = x[0]*y[0]*z[0];
		phi[1]  = x[1]*y[0]*z[0];
		phi[2]  = x[1]*y[1]*z[0];
		phi[3]  = x[0]*y[1]*z[0];
		phi[4]  = x[0]*y[0]*z[1];
		phi[5]  = x[1]*y[0]*z[1];
		phi[6]  = x[1]*y[1]*z[1];
		phi[7]  = x[0]*y[1]*z[1];
	}